

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

cl_int __thiscall
CLIntercept::allocateAndGetKernelInfoString
          (CLIntercept *this,cl_kernel kernel,cl_kernel_info param_name,char **param_value)

{
  cl_icd_dispatch *pcVar1;
  void *pvVar2;
  long *in_RCX;
  cl_kernel_info in_EDX;
  cl_kernel in_RSI;
  CLIntercept *in_RDI;
  size_t size;
  cl_int errorCode;
  int local_34;
  size_t local_30;
  int local_24;
  long *local_20;
  cl_kernel_info local_14;
  cl_kernel local_10;
  
  local_24 = 0;
  local_30 = 0;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  if (*in_RCX != 0) {
    local_34 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_34);
    if ((void *)*local_20 != (void *)0x0) {
      operator_delete__((void *)*local_20);
    }
    *local_20 = 0;
  }
  if (local_24 == 0) {
    pcVar1 = dispatch(in_RDI);
    local_24 = (*pcVar1->clGetKernelInfo)(local_10,local_14,0,(void *)0x0,&local_30);
  }
  if ((local_24 == 0) && (local_30 != 0)) {
    pvVar2 = operator_new__(local_30);
    *local_20 = (long)pvVar2;
    if (*local_20 == 0) {
      local_24 = -6;
    }
  }
  if (local_24 == 0) {
    pcVar1 = dispatch(in_RDI);
    local_24 = (*pcVar1->clGetKernelInfo)
                         (local_10,local_14,local_30,(void *)*local_20,(size_t *)0x0);
  }
  if (local_24 != 0) {
    if ((void *)*local_20 != (void *)0x0) {
      operator_delete__((void *)*local_20);
    }
    *local_20 = 0;
  }
  return local_24;
}

Assistant:

cl_int CLIntercept::allocateAndGetKernelInfoString(
    cl_kernel kernel,
    cl_kernel_info param_name,
    char*& param_value ) const
{
    cl_int  errorCode = CL_SUCCESS;
    size_t  size = 0;

    if( errorCode == CL_SUCCESS )
    {
        if( param_value != NULL )
        {
            CLI_ASSERT( 0 );
            delete [] param_value;
            param_value = NULL;
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetKernelInfo(
            kernel,
            param_name,
            0,
            NULL,
            &size );
    }

    if( errorCode == CL_SUCCESS )
    {
        if( size != 0 )
        {
            param_value = new char[ size ];
            if( param_value == NULL )
            {
                errorCode = CL_OUT_OF_HOST_MEMORY;
            }
        }
    }

    if( errorCode == CL_SUCCESS )
    {
        errorCode = dispatch().clGetKernelInfo(
            kernel,
            param_name,
            size,
            param_value,
            NULL );
    }

    if( errorCode != CL_SUCCESS )
    {
        delete [] param_value;
        param_value = NULL;
    }

    return errorCode;
}